

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_input_pack8_avx
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  long lVar10;
  long *in_RSI;
  long *in_RDI;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  __m256 _r0tm3;
  __m256 _r0tm2;
  __m256 _r0tm1;
  __m256 _r0tm0;
  __m256 _tmp03;
  __m256 _tmp02;
  __m256 _tmp01;
  __m256 _tmp00;
  int m_3;
  float *r0_tm_3;
  float *r0_tm_2;
  float *r0_tm_1;
  float *r0_tm_0;
  __m256 _tmp3m;
  __m256 _tmp2m;
  __m256 _tmp1m;
  __m256 _tmp0m;
  __m256 _r03;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  int m_2;
  float *r0;
  int j;
  int i;
  float tmp [4] [4] [8];
  Mat img0_tm;
  Mat img0;
  int q;
  int tiles;
  int h_tiles;
  int w_tiles;
  int inch;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  int local_a24;
  undefined1 (*local_a20) [32];
  undefined8 *local_a18;
  undefined8 *local_a10;
  undefined8 *local_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  int local_8f4;
  undefined1 (*local_8f0) [32];
  int local_8e8;
  int local_8e4;
  undefined8 local_8e0 [16];
  undefined8 auStack_860 [16];
  undefined8 auStack_7e0 [16];
  undefined1 auStack_760 [144];
  void *local_6d0;
  int *local_6c8;
  ulong local_6c0;
  undefined4 local_6b8;
  long *local_6b0;
  int local_6a8;
  int local_6a4;
  int local_6a0;
  undefined4 local_69c;
  undefined4 local_698;
  ulong local_690;
  void *local_688;
  int *local_680;
  ulong local_678;
  undefined4 local_670;
  long *local_668;
  int local_660;
  int local_65c;
  int local_658;
  undefined4 local_654;
  undefined4 local_650;
  ulong local_648;
  int local_63c;
  int local_638;
  int local_634;
  int local_630;
  int local_62c;
  int local_628;
  int local_624;
  long *local_618;
  long *local_610;
  void **local_608;
  void **local_5f8;
  int local_5d8;
  undefined4 local_5d4;
  void **local_5d0;
  int local_5b8;
  undefined4 local_5b4;
  void **local_5b0;
  undefined1 local_5a5;
  int local_5a4;
  void **local_598;
  void **local_578;
  int local_56c;
  void **local_568;
  undefined1 local_55d;
  int local_55c;
  void **local_550;
  void *local_520;
  void *local_510;
  undefined1 (*local_500) [32];
  undefined1 (*local_4f8) [32];
  undefined1 (*local_4f0) [32];
  undefined1 (*local_4e8) [32];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 (*local_4a8) [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 *local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 *local_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 (*local_308) [32];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 *local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 *local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  long *local_c0;
  undefined4 local_b4;
  ulong local_b0;
  void *local_a8;
  undefined4 local_9c;
  int local_98;
  int local_94;
  void **local_90;
  long *local_88;
  undefined4 local_7c;
  ulong local_78;
  void *local_70;
  undefined4 local_64;
  int local_60;
  int local_5c;
  void **local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  
  local_624 = *(int *)((long)in_RDI + 0x2c);
  local_628 = (int)in_RDI[6];
  local_62c = (int)in_RDI[7];
  local_630 = (local_624 + -2) / 2;
  local_634 = (local_628 + -2) / 2;
  local_638 = local_630 * local_634;
  local_618 = in_RSI;
  local_610 = in_RDI;
  for (local_63c = 0; local_63c < local_62c; local_63c = local_63c + 1) {
    local_550 = &local_688;
    local_94 = *(int *)((long)local_610 + 0x2c);
    local_98 = (int)local_610[6];
    local_9c = *(undefined4 *)((long)local_610 + 0x34);
    local_a8 = (void *)(*local_610 + local_610[8] * (long)local_63c * local_610[2]);
    local_b0 = local_610[2];
    local_b4 = (undefined4)local_610[3];
    local_c0 = (long *)local_610[4];
    local_90 = &local_688;
    local_688 = local_a8;
    local_680 = (int *)0x0;
    local_678 = local_b0;
    local_670 = local_b4;
    local_668 = local_c0;
    local_65c = local_94;
    local_658 = local_98;
    local_654 = 1;
    local_650 = local_9c;
    local_38 = (long)local_94 * (long)local_98 * local_b0;
    local_648 = (local_38 + 0xfU & 0xfffffffffffffff0) / local_b0;
    local_660 = (int)local_610[5] + -1;
    if ((int)local_610[5] == 4) {
      local_648 = (long)*(int *)((long)local_610 + 0x2c) * (long)(int)local_610[6];
    }
    local_598 = &local_6d0;
    local_5c = *(int *)((long)local_618 + 0x2c);
    local_60 = (int)local_618[6];
    local_64 = *(undefined4 *)((long)local_618 + 0x34);
    local_70 = (void *)(*local_618 + local_618[8] * (long)local_63c * local_618[2]);
    local_78 = local_618[2];
    local_7c = (undefined4)local_618[3];
    local_88 = (long *)local_618[4];
    local_58 = &local_6d0;
    local_6d0 = local_70;
    local_6c8 = (int *)0x0;
    local_6c0 = local_78;
    local_6b8 = local_7c;
    local_6b0 = local_88;
    local_6a4 = local_5c;
    local_6a0 = local_60;
    local_69c = 1;
    local_698 = local_64;
    local_48 = (long)local_5c * (long)local_60 * local_78;
    local_690 = (local_48 + 0xfU & 0xfffffffffffffff0) / local_78;
    local_6a8 = (int)local_618[5] + -1;
    if ((int)local_618[5] == 4) {
      local_690 = (long)*(int *)((long)local_618 + 0x2c) * (long)(int)local_618[6];
    }
    local_3c = 0x10;
    local_4c = 0x10;
    local_55c = local_63c;
    local_55d = 1;
    local_5a4 = local_63c;
    local_5a5 = 1;
    for (local_8e4 = 0; local_8e4 < local_634; local_8e4 = local_8e4 + 1) {
      for (local_8e8 = 0; local_8e8 < local_630; local_8e8 = local_8e8 + 1) {
        local_56c = local_8e4 << 1;
        local_568 = &local_688;
        local_8f0 = (undefined1 (*) [32])
                    ((long)local_688 +
                    (long)(local_8e8 << 4) * 4 + (long)local_65c * (long)local_56c * local_678);
        for (local_8f4 = 0; local_8f4 < 4; local_8f4 = local_8f4 + 1) {
          local_4e8 = local_8f0;
          local_e0 = *(undefined8 *)*local_8f0;
          uStack_d8 = *(undefined8 *)(*local_8f0 + 8);
          uStack_d0 = *(undefined8 *)(*local_8f0 + 0x10);
          uStack_c8 = *(undefined8 *)(*local_8f0 + 0x18);
          local_4f0 = local_8f0 + 1;
          local_180 = *(undefined8 *)*local_4f0;
          uStack_178 = *(undefined8 *)(local_8f0[1] + 8);
          uStack_170 = *(undefined8 *)(local_8f0[1] + 0x10);
          uStack_168 = *(undefined8 *)(local_8f0[1] + 0x18);
          local_4f8 = local_8f0 + 2;
          local_120 = *(undefined8 *)*local_4f8;
          uStack_118 = *(undefined8 *)(local_8f0[2] + 8);
          uStack_110 = *(undefined8 *)(local_8f0[2] + 0x10);
          uStack_108 = *(undefined8 *)(local_8f0[2] + 0x18);
          local_500 = local_8f0 + 3;
          local_160 = *(undefined8 *)*local_500;
          uStack_158 = *(undefined8 *)(local_8f0[3] + 8);
          uStack_150 = *(undefined8 *)(local_8f0[3] + 0x10);
          uStack_148 = *(undefined8 *)(local_8f0[3] + 0x18);
          auVar1 = vsubps_avx(*local_8f0,*local_4f8);
          local_360._0_4_ = (float)local_180;
          local_360._4_4_ = (float)((ulong)local_180 >> 0x20);
          uStack_358._0_4_ = (float)uStack_178;
          uStack_358._4_4_ = (float)((ulong)uStack_178 >> 0x20);
          uStack_350._0_4_ = (float)uStack_170;
          uStack_350._4_4_ = (float)((ulong)uStack_170 >> 0x20);
          uStack_348._0_4_ = (float)uStack_168;
          uStack_348._4_4_ = (float)((ulong)uStack_168 >> 0x20);
          local_380._0_4_ = (float)local_120;
          local_380._4_4_ = (float)((ulong)local_120 >> 0x20);
          uStack_378._0_4_ = (float)uStack_118;
          uStack_378._4_4_ = (float)((ulong)uStack_118 >> 0x20);
          uStack_370._0_4_ = (float)uStack_110;
          uStack_370._4_4_ = (float)((ulong)uStack_110 >> 0x20);
          uStack_368._0_4_ = (float)uStack_108;
          uStack_368._4_4_ = (float)((ulong)uStack_108 >> 0x20);
          fVar11 = (float)local_360 + (float)local_380;
          fVar12 = local_360._4_4_ + local_380._4_4_;
          fVar13 = (float)uStack_358 + (float)uStack_378;
          fVar14 = uStack_358._4_4_ + uStack_378._4_4_;
          fVar15 = (float)uStack_350 + (float)uStack_370;
          fVar16 = uStack_350._4_4_ + uStack_370._4_4_;
          fVar17 = (float)uStack_348 + (float)uStack_368;
          fVar18 = uStack_348._4_4_ + uStack_368._4_4_;
          auVar2 = vsubps_avx(*local_4f8,*local_4f0);
          auVar3 = vsubps_avx(*local_500,*local_4f0);
          lVar10 = (long)local_8f4;
          local_248 = local_8e0 + lVar10 * 4;
          local_9a0 = auVar1._0_8_;
          uStack_998 = auVar1._8_8_;
          uStack_990 = auVar1._16_8_;
          uStack_988 = auVar1._24_8_;
          local_280 = local_9a0;
          uStack_278 = uStack_998;
          uStack_270 = uStack_990;
          uStack_268 = uStack_988;
          local_380 = local_120;
          uStack_378 = uStack_118;
          uStack_370 = uStack_110;
          uStack_368 = uStack_108;
          local_360 = local_180;
          uStack_358 = uStack_178;
          uStack_350 = uStack_170;
          uStack_348 = uStack_168;
          local_140 = local_180;
          uStack_138 = uStack_178;
          uStack_130 = uStack_170;
          uStack_128 = uStack_168;
          local_100 = local_120;
          uStack_f8 = uStack_118;
          uStack_f0 = uStack_110;
          uStack_e8 = uStack_108;
          *local_248 = local_9a0;
          local_8e0[lVar10 * 4 + 1] = uStack_998;
          local_8e0[lVar10 * 4 + 2] = uStack_990;
          local_8e0[lVar10 * 4 + 3] = uStack_988;
          lVar10 = (long)local_8f4;
          local_288 = local_8e0 + lVar10 * 4 + 0x10;
          local_2c0 = CONCAT44(fVar12,fVar11);
          uVar4 = CONCAT44(fVar14,fVar13);
          uVar5 = CONCAT44(fVar16,fVar15);
          uVar6 = CONCAT44(fVar18,fVar17);
          uStack_2b8 = uVar4;
          uStack_2b0 = uVar5;
          uStack_2a8 = uVar6;
          *local_288 = local_2c0;
          auStack_7e0[lVar10 * 4 + -0xf] = uVar4;
          auStack_7e0[lVar10 * 4 + -0xe] = uVar5;
          auStack_7e0[lVar10 * 4 + -0xd] = uVar6;
          lVar10 = (long)local_8f4;
          local_2c8 = auStack_7e0 + lVar10 * 4;
          local_9e0 = auVar2._0_8_;
          uStack_9d8 = auVar2._8_8_;
          uStack_9d0 = auVar2._16_8_;
          uStack_9c8 = auVar2._24_8_;
          local_300 = local_9e0;
          uStack_2f8 = uStack_9d8;
          uStack_2f0 = uStack_9d0;
          uStack_2e8 = uStack_9c8;
          *local_2c8 = local_9e0;
          auStack_7e0[lVar10 * 4 + 1] = uStack_9d8;
          auStack_7e0[lVar10 * 4 + 2] = uStack_9d0;
          auStack_7e0[lVar10 * 4 + 3] = uStack_9c8;
          local_308 = (undefined1 (*) [32])(auStack_760 + (long)local_8f4 * 0x20);
          local_a00 = auVar3._0_8_;
          uStack_9f8 = auVar3._8_8_;
          uStack_9f0 = auVar3._16_8_;
          uStack_9e8 = auVar3._24_8_;
          local_340 = local_a00;
          uStack_338 = uStack_9f8;
          uStack_330 = uStack_9f0;
          uStack_328 = uStack_9e8;
          *local_308 = auVar3;
          local_8f0 = (undefined1 (*) [32])(*local_8f0 + (long)(local_624 << 3) * 4);
        }
        local_578 = &local_6d0;
        local_a08 = (undefined8 *)
                    ((long)local_6d0 + (long)((local_8e4 * local_630 + local_8e8) * 8) * 4);
        local_a10 = (undefined8 *)((long)local_a08 + (long)(local_638 << 3) * 4);
        local_a18 = (undefined8 *)((long)local_a08 + (long)(local_638 << 4) * 4);
        local_a20 = (undefined1 (*) [32])((long)local_a08 + (long)(local_638 * 0x18) * 4);
        for (local_a24 = 0; local_a24 < 4; local_a24 = local_a24 + 1) {
          lVar10 = (long)local_a24;
          local_3c8 = local_8e0 + lVar10 * 0x10;
          local_1a0 = *local_3c8;
          uStack_198 = local_8e0[lVar10 * 0x10 + 1];
          uStack_190 = local_8e0[lVar10 * 0x10 + 2];
          uStack_188 = local_8e0[lVar10 * 0x10 + 3];
          lVar10 = (long)local_a24;
          local_3d0 = local_8e0 + lVar10 * 0x10 + 4;
          local_240 = *local_3d0;
          uStack_238 = local_8e0[lVar10 * 0x10 + 5];
          uStack_230 = local_8e0[lVar10 * 0x10 + 6];
          uStack_228 = local_8e0[lVar10 * 0x10 + 7];
          lVar10 = (long)local_a24;
          local_3d8 = local_8e0 + lVar10 * 0x10 + 8;
          local_1e0 = *local_3d8;
          uStack_1d8 = local_8e0[lVar10 * 0x10 + 9];
          uStack_1d0 = local_8e0[lVar10 * 0x10 + 10];
          uStack_1c8 = local_8e0[lVar10 * 0x10 + 0xb];
          lVar10 = (long)local_a24;
          local_3e0 = local_8e0 + lVar10 * 0x10 + 0xc;
          local_220 = *local_3e0;
          uStack_218 = local_8e0[lVar10 * 0x10 + 0xd];
          uStack_210 = local_8e0[lVar10 * 0x10 + 0xe];
          uStack_208 = local_8e0[lVar10 * 0x10 + 0xf];
          auVar9._8_8_ = uStack_198;
          auVar9._0_8_ = local_1a0;
          auVar9._16_8_ = uStack_190;
          auVar9._24_8_ = uStack_188;
          auVar1._8_8_ = uStack_1d8;
          auVar1._0_8_ = local_1e0;
          auVar1._16_8_ = uStack_1d0;
          auVar1._24_8_ = uStack_1c8;
          auVar1 = vsubps_avx(auVar9,auVar1);
          local_3a0._0_4_ = (float)local_240;
          local_3a0._4_4_ = (float)((ulong)local_240 >> 0x20);
          uStack_398._0_4_ = (float)uStack_238;
          uStack_398._4_4_ = (float)((ulong)uStack_238 >> 0x20);
          uStack_390._0_4_ = (float)uStack_230;
          uStack_390._4_4_ = (float)((ulong)uStack_230 >> 0x20);
          uStack_388._0_4_ = (float)uStack_228;
          uStack_388._4_4_ = (float)((ulong)uStack_228 >> 0x20);
          local_3c0._0_4_ = (float)local_1e0;
          local_3c0._4_4_ = (float)((ulong)local_1e0 >> 0x20);
          uStack_3b8._0_4_ = (float)uStack_1d8;
          uStack_3b8._4_4_ = (float)((ulong)uStack_1d8 >> 0x20);
          uStack_3b0._0_4_ = (float)uStack_1d0;
          uStack_3b0._4_4_ = (float)((ulong)uStack_1d0 >> 0x20);
          uStack_3a8._0_4_ = (float)uStack_1c8;
          uStack_3a8._4_4_ = (float)((ulong)uStack_1c8 >> 0x20);
          auVar8._8_8_ = uStack_1d8;
          auVar8._0_8_ = local_1e0;
          auVar8._16_8_ = uStack_1d0;
          auVar8._24_8_ = uStack_1c8;
          auVar2._8_8_ = uStack_238;
          auVar2._0_8_ = local_240;
          auVar2._16_8_ = uStack_230;
          auVar2._24_8_ = uStack_228;
          auVar2 = vsubps_avx(auVar8,auVar2);
          auVar7._8_8_ = uStack_218;
          auVar7._0_8_ = local_220;
          auVar7._16_8_ = uStack_210;
          auVar7._24_8_ = uStack_208;
          auVar3._8_8_ = uStack_238;
          auVar3._0_8_ = local_240;
          auVar3._16_8_ = uStack_230;
          auVar3._24_8_ = uStack_228;
          auVar3 = vsubps_avx(auVar7,auVar3);
          local_3e8 = local_a08;
          local_ae0 = auVar1._0_8_;
          local_420 = local_ae0;
          uStack_ad8 = auVar1._8_8_;
          uStack_418 = uStack_ad8;
          uStack_ad0 = auVar1._16_8_;
          uStack_410 = uStack_ad0;
          uStack_ac8 = auVar1._24_8_;
          uStack_408 = uStack_ac8;
          *local_a08 = local_ae0;
          local_a08[1] = uStack_ad8;
          local_a08[2] = uStack_ad0;
          local_a08[3] = uStack_ac8;
          local_428 = local_a10;
          local_460 = CONCAT44(local_3a0._4_4_ + local_3c0._4_4_,(float)local_3a0 + (float)local_3c0
                              );
          uStack_458 = CONCAT44(uStack_398._4_4_ + uStack_3b8._4_4_,
                                (float)uStack_398 + (float)uStack_3b8);
          uStack_450 = CONCAT44(uStack_390._4_4_ + uStack_3b0._4_4_,
                                (float)uStack_390 + (float)uStack_3b0);
          uStack_448 = CONCAT44(uStack_388._4_4_ + uStack_3a8._4_4_,
                                (float)uStack_388 + (float)uStack_3a8);
          *local_a10 = local_460;
          local_a10[1] = uStack_458;
          local_a10[2] = uStack_450;
          local_a10[3] = uStack_448;
          local_468 = local_a18;
          local_b20 = auVar2._0_8_;
          local_4a0 = local_b20;
          uStack_b18 = auVar2._8_8_;
          uStack_498 = uStack_b18;
          uStack_b10 = auVar2._16_8_;
          uStack_490 = uStack_b10;
          uStack_b08 = auVar2._24_8_;
          uStack_488 = uStack_b08;
          *local_a18 = local_b20;
          local_a18[1] = uStack_b18;
          local_a18[2] = uStack_b10;
          local_a18[3] = uStack_b08;
          local_4a8 = local_a20;
          local_b40 = auVar3._0_8_;
          local_4e0 = local_b40;
          uStack_b38 = auVar3._8_8_;
          uStack_4d8 = uStack_b38;
          uStack_b30 = auVar3._16_8_;
          uStack_4d0 = uStack_b30;
          uStack_b28 = auVar3._24_8_;
          uStack_4c8 = uStack_b28;
          *local_a20 = auVar3;
          local_a08 = (undefined8 *)((long)local_a08 + (long)(local_638 << 5) * 4);
          local_a10 = (undefined8 *)((long)local_a10 + (long)(local_638 << 5) * 4);
          local_a18 = (undefined8 *)((long)local_a18 + (long)(local_638 << 5) * 4);
          local_a20 = (undefined1 (*) [32])(*local_a20 + (long)(local_638 << 5) * 4);
          local_3c0 = local_1e0;
          uStack_3b8 = uStack_1d8;
          uStack_3b0 = uStack_1d0;
          uStack_3a8 = uStack_1c8;
          local_3a0 = local_240;
          uStack_398 = uStack_238;
          uStack_390 = uStack_230;
          uStack_388 = uStack_228;
          local_200 = local_240;
          uStack_1f8 = uStack_238;
          uStack_1f0 = uStack_230;
          uStack_1e8 = uStack_228;
          local_1c0 = local_1e0;
          uStack_1b8 = uStack_1d8;
          uStack_1b0 = uStack_1d0;
          uStack_1a8 = uStack_1c8;
        }
      }
    }
    local_608 = &local_6d0;
    local_5b0 = local_608;
    if (local_6c8 != (int *)0x0) {
      local_5b4 = 0xffffffff;
      LOCK();
      local_5b8 = *local_6c8;
      *local_6c8 = *local_6c8 + -1;
      UNLOCK();
      if (local_5b8 == 1) {
        if (local_6b0 == (long *)0x0) {
          local_520 = local_6d0;
          if (local_6d0 != (void *)0x0) {
            free(local_6d0);
          }
        }
        else {
          (**(code **)(*local_6b0 + 0x18))(local_6b0,local_6d0);
        }
      }
    }
    local_6d0 = (void *)0x0;
    local_6c0 = 0;
    local_6b8 = 0;
    local_6a8 = 0;
    local_6a4 = 0;
    local_6a0 = 0;
    local_69c = 0;
    local_698 = 0;
    local_690 = 0;
    local_6c8 = (int *)0x0;
    local_5f8 = &local_688;
    local_5d0 = local_5f8;
    if (local_680 != (int *)0x0) {
      local_5d4 = 0xffffffff;
      LOCK();
      local_5d8 = *local_680;
      *local_680 = *local_680 + -1;
      UNLOCK();
      if (local_5d8 == 1) {
        if (local_668 == (long *)0x0) {
          local_510 = local_688;
          if (local_688 != (void *)0x0) {
            free(local_688);
          }
        }
        else {
          (**(code **)(*local_668 + 0x18))(local_668,local_688);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_input_pack8_avx(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 2;
    const int h_tiles = (h - 2) / 2;
    const int tiles = w_tiles * h_tiles;

    // const float itm[4][4] = {
    //     {1.0f,  0.0f, -1.0f,  0.0f},
    //     {0.0f,  1.0f,  1.00f, 0.0f},
    //     {0.0f, -1.0f,  1.00f, 0.0f},
    //     {0.0f, -1.0f,  0.00f, 1.0f}
    // };

    // 0 = r00 - r02
    // 1 = r01 + r02
    // 2 = r02 - r01
    // 3 = r03 - r01

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

#ifdef _MSC_VER
        __declspec(align(32))
#else
        __attribute__((aligned(32)))
#endif
        float tmp[4][4][8];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 2) + (j * 2) * 8;

                for (int m = 0; m < 4; m++)
                {
                    __m256 _r00 = _mm256_load_ps(r0);
                    __m256 _r01 = _mm256_load_ps(r0 + 8);
                    __m256 _r02 = _mm256_load_ps(r0 + 8 * 2);
                    __m256 _r03 = _mm256_load_ps(r0 + 8 * 3);

                    __m256 _tmp0m = _mm256_sub_ps(_r00, _r02);
                    __m256 _tmp1m = _mm256_add_ps(_r01, _r02);
                    __m256 _tmp2m = _mm256_sub_ps(_r02, _r01);
                    __m256 _tmp3m = _mm256_sub_ps(_r03, _r01);

#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    _mm256_storeu_ps(tmp[0][m], _tmp0m);
                    _mm256_storeu_ps(tmp[1][m], _tmp1m);
                    _mm256_storeu_ps(tmp[2][m], _tmp2m);
                    _mm256_storeu_ps(tmp[3][m], _tmp3m);
#else
                    _mm256_store_ps(tmp[0][m], _tmp0m);
                    _mm256_store_ps(tmp[1][m], _tmp1m);
                    _mm256_store_ps(tmp[2][m], _tmp2m);
                    _mm256_store_ps(tmp[3][m], _tmp3m);
#endif

                    r0 += w * 8;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j) * 8;
                float* r0_tm_1 = r0_tm_0 + tiles * 8;
                float* r0_tm_2 = r0_tm_0 + tiles * 8 * 2;
                float* r0_tm_3 = r0_tm_0 + tiles * 8 * 3;

                for (int m = 0; m < 4; m++)
                {
#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    __m256 _tmp00 = _mm256_loadu_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_loadu_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_loadu_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_loadu_ps(tmp[m][3]);
#else
                    __m256 _tmp00 = _mm256_load_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_load_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_load_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_load_ps(tmp[m][3]);
#endif

                    __m256 _r0tm0 = _mm256_sub_ps(_tmp00, _tmp02);
                    __m256 _r0tm1 = _mm256_add_ps(_tmp01, _tmp02);
                    __m256 _r0tm2 = _mm256_sub_ps(_tmp02, _tmp01);
                    __m256 _r0tm3 = _mm256_sub_ps(_tmp03, _tmp01);

                    _mm256_store_ps(r0_tm_0, _r0tm0);
                    _mm256_store_ps(r0_tm_1, _r0tm1);
                    _mm256_store_ps(r0_tm_2, _r0tm2);
                    _mm256_store_ps(r0_tm_3, _r0tm3);

                    r0_tm_0 += tiles * 8 * 4;
                    r0_tm_1 += tiles * 8 * 4;
                    r0_tm_2 += tiles * 8 * 4;
                    r0_tm_3 += tiles * 8 * 4;
                }
            }
        }
    }
}